

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O3

void __thiscall leveldb::DBImpl::MaybeIgnoreError(DBImpl *this,Status *s)

{
  Logger *info_log;
  char *pcVar1;
  string local_38;
  
  if ((s->state_ != (char *)0x0) && ((this->options_).paranoid_checks == false)) {
    info_log = (this->options_).info_log;
    Status::ToString_abi_cxx11_(&local_38,s);
    Log(info_log,"Ignoring error %s",local_38._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    pcVar1 = s->state_;
    s->state_ = (char *)0x0;
    if (pcVar1 != (char *)0x0) {
      operator_delete__(pcVar1);
    }
  }
  return;
}

Assistant:

bool ok() const { return (state_ == nullptr); }